

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XMLReader::skipIfQuote(XMLReader *this,XMLCh *chGotten)

{
  XMLCh XVar1;
  XMLSize_t XVar2;
  bool bVar3;
  
  if ((this->fCharIndex != this->fCharsAvail) || (bVar3 = refreshCharBuffer(this), bVar3)) {
    XVar2 = this->fCharIndex;
    XVar1 = this->fCharBuf[XVar2];
    *chGotten = XVar1;
    if ((XVar1 == L'\'') || (XVar1 == L'\"')) {
      this->fCharIndex = XVar2 + 1;
      this->fCurCol = this->fCurCol + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLReader::skipIfQuote(XMLCh& chGotten)
{
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
        return false;

    chGotten = fCharBuf[fCharIndex];
    if ((chGotten == chDoubleQuote) || (chGotten == chSingleQuote))
    {
        fCharIndex++;
        fCurCol++;
        return true;
    }
    return false;
}